

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O3

void skiwi::anon_unknown_26::fold_fx_greater(PrimitiveCall *p,Expression *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Expression *e_00;
  bool bVar3;
  Fixnum f2;
  Fixnum f1;
  Literal lit2;
  Literal lit1;
  Fixnum local_1c8;
  Fixnum local_180;
  True local_138;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_f8;
  undefined1 local_98;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_90;
  undefined1 local_30;
  
  e_00 = (p->arguments).
         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(p->arguments).
            super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)e_00 == 0x1e0) {
    local_90._32_8_ = local_90._M_first._M_storage._M_storage + 0x30;
    local_90._0_8_ = 0xffffffffffffffff;
    local_90._M_first._M_storage._M_storage[9] = '\0';
    local_90._16_8_ = 0;
    local_90._24_8_ = 0;
    local_90._40_8_ = 0;
    local_90._M_first._M_storage._M_storage[0x30] = '\0';
    local_30 = 0;
    local_f8._32_8_ = local_f8._M_first._M_storage._M_storage + 0x30;
    local_f8._0_8_ = 0xffffffffffffffff;
    local_f8._M_first._M_storage._M_storage[9] = '\0';
    local_f8._16_8_ = 0;
    local_f8._24_8_ = 0;
    local_f8._40_8_ = 0;
    local_f8._M_first._M_storage._M_storage[0x30] = '\0';
    local_98 = 0;
    paVar2 = &local_180.filename.field_2;
    local_180.line_nr = -1;
    local_180.column_nr = -1;
    local_180.tail_position = false;
    local_180.pre_scan_index = 0;
    local_180.scan_index = 0;
    local_180.filename._M_string_length = 0;
    local_180.filename.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_1c8.filename.field_2;
    local_1c8.line_nr = -1;
    local_1c8.column_nr = -1;
    local_1c8.tail_position = false;
    local_1c8.pre_scan_index = 0;
    local_1c8.scan_index = 0;
    local_1c8.filename._M_string_length = 0;
    local_1c8.filename.field_2._M_local_buf[0] = '\0';
    local_1c8.filename._M_dataplus._M_p = (pointer)paVar1;
    local_180.filename._M_dataplus._M_p = (pointer)paVar2;
    bVar3 = is_literal((Literal *)&local_90._M_first,e_00);
    if (bVar3) {
      bVar3 = is_literal((Literal *)&local_f8._M_first,
                         (p->arguments).
                         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
      if (bVar3) {
        bVar3 = is_fixnum(&local_180,(Literal *)&local_90._M_first);
        if (bVar3) {
          bVar3 = is_fixnum(&local_1c8,(Literal *)&local_f8._M_first);
          if (bVar3) {
            if (local_1c8.value < local_180.value) {
              local_138.filename._M_dataplus._M_p = (pointer)&local_138.filename.field_2;
              local_138.line_nr = -1;
              local_138.column_nr = -1;
              local_138.tail_position = false;
              local_138.pre_scan_index = 0;
              local_138.scan_index = 0;
              local_138.filename._M_string_length = 0;
              local_138.filename.field_2._M_local_buf[0] = '\0';
              std::
              variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
              ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                           *)e,&local_138);
            }
            else {
              local_138.filename._M_dataplus._M_p = (pointer)&local_138.filename.field_2;
              local_138.line_nr = -1;
              local_138.column_nr = -1;
              local_138.tail_position = false;
              local_138.pre_scan_index = 0;
              local_138.scan_index = 0;
              local_138.filename._M_string_length = 0;
              local_138.filename.field_2._M_local_buf[0] = '\0';
              std::
              variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
              ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                           *)e,(False *)&local_138);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
              operator_delete(local_138.filename._M_dataplus._M_p,
                              CONCAT71(local_138.filename.field_2._M_allocated_capacity._1_7_,
                                       local_138.filename.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8.filename._M_dataplus._M_p,
                      CONCAT71(local_1c8.filename.field_2._M_allocated_capacity._1_7_,
                               local_1c8.filename.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_180.filename._M_dataplus._M_p,
                      CONCAT71(local_180.filename.field_2._M_allocated_capacity._1_7_,
                               local_180.filename.field_2._M_local_buf[0]) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_f8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_90._M_first);
    return;
  }
  __assert_fail("p.arguments.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/constant_folding.cpp"
                ,0xf9,
                "void skiwi::(anonymous namespace)::fold_fx_greater(PrimitiveCall &, Expression &)")
  ;
}

Assistant:

void fold_fx_greater(PrimitiveCall& p, Expression& e)
    {
    assert(p.arguments.size() == 2);
    Literal lit1, lit2;
    Fixnum f1, f2;
    if (is_literal(lit1, p.arguments[0]) && is_literal(lit2, p.arguments[1]))
      {
      if (is_fixnum(f1, lit1) && is_fixnum(f2, lit2))
        {
        if (f1.value > f2.value)
          e = make_true();
        else
          e = make_false();
        }
      }
    }